

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

bool tinyobj::tryParseDouble(char *s,char *s_end,double *result)

{
  byte bVar1;
  undefined1 auVar2 [16];
  long lVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  char cVar7;
  ulong uVar8;
  int iVar9;
  byte *pbVar10;
  byte *pbVar11;
  byte *pbVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  double dVar16;
  undefined1 auVar18 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar19 [64];
  undefined8 in_XMM3_Qb;
  double local_48;
  undefined1 extraout_var [56];
  
  if (s_end <= s) {
    return false;
  }
  cVar7 = *s;
  if ((cVar7 == '-') || (cVar7 == '+')) {
    s = s + 1;
    if (s == s_end) {
      bVar13 = false;
    }
    else {
      bVar13 = *s == 0x2e;
    }
LAB_009798f6:
    bVar14 = s != s_end;
    auVar19 = ZEXT864(0) << 0x40;
    if (!bVar13) {
      if (s == s_end) {
        bVar13 = true;
      }
      else {
        uVar4 = (int)*s - 0x30;
        bVar13 = 9 < uVar4;
        if (!bVar13) {
          do {
            pbVar10 = (byte *)s + 1;
            auVar19 = ZEXT864((ulong)(auVar19._0_8_ * 10.0 + (double)(int)uVar4));
            s = s_end;
            if (pbVar10 == (byte *)s_end) break;
            uVar4 = (int)(char)*pbVar10 - 0x30;
            s = (char *)pbVar10;
          } while (uVar4 < 10);
          bVar14 = pbVar10 != (byte *)s_end;
        }
      }
      if (bVar13) goto LAB_00979964;
    }
    auVar17 = auVar19._0_16_;
    iVar6 = 0;
    iVar9 = 0;
    if (bVar14) {
      bVar1 = *s;
      pbVar10 = (byte *)s;
      iVar9 = iVar6;
      if ((bVar1 != 0x65) && (bVar1 != 0x45)) {
        if (bVar1 != 0x2e) goto LAB_00979adf;
        pbVar10 = (byte *)s + 1;
        bVar14 = pbVar10 != (byte *)s_end;
        if ((bVar14) && (uVar4 = (int)(char)((byte *)s)[1] - 0x30, uVar4 < 10)) {
          uVar8 = 1;
          iVar6 = -1;
          pbVar12 = (byte *)s + 2;
          do {
            pbVar11 = pbVar12;
            if (uVar8 < 8) {
              auVar17._8_8_ = 0;
              auVar17._0_8_ = tryParseDouble::pow_lut[uVar8];
            }
            else {
              auVar18._0_8_ = pow(10.0,(double)iVar6);
              auVar18._8_56_ = extraout_var;
              auVar17 = auVar18._0_16_;
            }
            auVar15._0_8_ = (double)(int)uVar4;
            auVar15._8_8_ = in_XMM3_Qb;
            auVar17 = vfmadd231sd_fma(auVar19._0_16_,auVar17,auVar15);
            auVar19 = ZEXT1664(auVar17);
            bVar14 = pbVar11 != (byte *)s_end;
            pbVar10 = (byte *)s_end;
            if (pbVar11 == (byte *)s_end) break;
            uVar8 = uVar8 + 1;
            uVar4 = (int)(char)*pbVar11 - 0x30;
            iVar6 = iVar6 + -1;
            pbVar12 = pbVar11 + 1;
            pbVar10 = pbVar11;
          } while (uVar4 < 10);
        }
      }
      if ((bVar14) && ((*pbVar10 | 0x20) == 0x65)) {
        pbVar12 = pbVar10 + 1;
        if ((pbVar12 == (byte *)s_end) || ((bVar1 = *pbVar12, bVar1 != 0x2d && (bVar1 != 0x2b)))) {
          iVar6 = 1;
          if (9 < (int)(char)*pbVar12 - 0x30U) goto LAB_00979964;
        }
        else {
          pbVar12 = pbVar10 + 2;
          iVar6 = ((bVar1 == 0x2b) - 1) + (uint)(bVar1 == 0x2b);
        }
        if (pbVar12 == (byte *)s_end) {
          bVar13 = true;
          iVar9 = 0;
        }
        else {
          lVar5 = 0;
          iVar9 = 0;
          do {
            if (9 < (int)(char)pbVar12[lVar5] - 0x30U) goto LAB_00979ac7;
            iVar9 = ((int)(char)pbVar12[lVar5] - 0x30U) + iVar9 * 10;
            lVar3 = lVar5 + 1;
            lVar5 = lVar5 + 1;
          } while (pbVar12 + lVar3 != (byte *)s_end);
          lVar5 = 1;
LAB_00979ac7:
          bVar13 = (int)lVar5 == 0;
        }
        if (bVar13) goto LAB_00979964;
        iVar9 = iVar9 * iVar6;
      }
    }
LAB_00979adf:
    if (iVar9 != 0) {
      dVar16 = pow(5.0,(double)iVar9);
      local_48 = auVar17._0_8_;
      auVar19._0_8_ = ldexp(dVar16 * local_48,iVar9);
      auVar19._8_56_ = extraout_var_00;
      auVar17 = auVar19._0_16_;
    }
    auVar2._8_8_ = 0x8000000000000000;
    auVar2._0_8_ = 0x8000000000000000;
    auVar15 = vxorpd_avx512vl(auVar17,auVar2);
    *result = (double)((ulong)(cVar7 == '+') * auVar17._0_8_ + (ulong)(cVar7 != '+') * auVar15._0_8_
                      );
    bVar13 = true;
  }
  else {
    if ((int)cVar7 - 0x30U < 10) {
      bVar13 = false;
      cVar7 = '+';
      goto LAB_009798f6;
    }
    bVar13 = true;
    bVar14 = cVar7 == '.';
    cVar7 = '+';
    if (bVar14) goto LAB_009798f6;
LAB_00979964:
    bVar13 = false;
  }
  return bVar13;
}

Assistant:

static bool tryParseDouble(const char *s, const char *s_end, double *result) {
  if (s >= s_end) {
    return false;
  }

  double mantissa = 0.0;
  // This exponent is base 2 rather than 10.
  // However the exponent we parse is supposed to be one of ten,
  // thus we must take care to convert the exponent/and or the
  // mantissa to a * 2^E, where a is the mantissa and E is the
  // exponent.
  // To get the final double we will use ldexp, it requires the
  // exponent to be in base 2.
  int exponent = 0;

  // NOTE: THESE MUST BE DECLARED HERE SINCE WE ARE NOT ALLOWED
  // TO JUMP OVER DEFINITIONS.
  char sign = '+';
  char exp_sign = '+';
  char const *curr = s;

  // How many characters were read in a loop.
  int read = 0;
  // Tells whether a loop terminated due to reaching s_end.
  bool end_not_reached = false;
  bool leading_decimal_dots = false;

  /*
          BEGIN PARSING.
  */

  // Find out what sign we've got.
  if (*curr == '+' || *curr == '-') {
    sign = *curr;
    curr++;
    if ((curr != s_end) && (*curr == '.')) {
      // accept. Somethig like `.7e+2`, `-.5234`
      leading_decimal_dots = true;
    }
  } else if (IS_DIGIT(*curr)) { /* Pass through. */
  } else if (*curr == '.') {
    // accept. Somethig like `.7e+2`, `-.5234`
    leading_decimal_dots = true;
  } else {
    goto fail;
  }

  // Read the integer part.
  end_not_reached = (curr != s_end);
  if (!leading_decimal_dots) {
    while (end_not_reached && IS_DIGIT(*curr)) {
      mantissa *= 10;
      mantissa += static_cast<int>(*curr - 0x30);
      curr++;
      read++;
      end_not_reached = (curr != s_end);
    }

    // We must make sure we actually got something.
    if (read == 0) goto fail;
  }

  // We allow numbers of form "#", "###" etc.
  if (!end_not_reached) goto assemble;

  // Read the decimal part.
  if (*curr == '.') {
    curr++;
    read = 1;
    end_not_reached = (curr != s_end);
    while (end_not_reached && IS_DIGIT(*curr)) {
      static const double pow_lut[] = {
          1.0, 0.1, 0.01, 0.001, 0.0001, 0.00001, 0.000001, 0.0000001,
      };
      const int lut_entries = sizeof pow_lut / sizeof pow_lut[0];

      // NOTE: Don't use powf here, it will absolutely murder precision.
      mantissa += static_cast<int>(*curr - 0x30) *
                  (read < lut_entries ? pow_lut[read] : std::pow(10.0, -read));
      read++;
      curr++;
      end_not_reached = (curr != s_end);
    }
  } else if (*curr == 'e' || *curr == 'E') {
  } else {
    goto assemble;
  }

  if (!end_not_reached) goto assemble;

  // Read the exponent part.
  if (*curr == 'e' || *curr == 'E') {
    curr++;
    // Figure out if a sign is present and if it is.
    end_not_reached = (curr != s_end);
    if (end_not_reached && (*curr == '+' || *curr == '-')) {
      exp_sign = *curr;
      curr++;
    } else if (IS_DIGIT(*curr)) { /* Pass through. */
    } else {
      // Empty E is not allowed.
      goto fail;
    }

    read = 0;
    end_not_reached = (curr != s_end);
    while (end_not_reached && IS_DIGIT(*curr)) {
      exponent *= 10;
      exponent += static_cast<int>(*curr - 0x30);
      curr++;
      read++;
      end_not_reached = (curr != s_end);
    }
    exponent *= (exp_sign == '+' ? 1 : -1);
    if (read == 0) goto fail;
  }

assemble:
  *result = (sign == '+' ? 1 : -1) *
            (exponent ? std::ldexp(mantissa * std::pow(5.0, exponent), exponent)
                      : mantissa);
  return true;
fail:
  return false;
}